

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O0

int idaNlsLSolveSensSim(N_Vector deltaSim,void *ida_mem)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  undefined8 *in_RDI;
  N_Vector *deltaS;
  N_Vector delta;
  int is;
  int retval;
  IDAMem IDA_mem;
  int local_28;
  int local_4;
  
  if (in_RSI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x144,"idaNlsLSolveSensSim",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    iVar2 = (**(code **)(in_RSI + 0x748))
                      (in_RSI,**(undefined8 **)*in_RDI,*(undefined8 *)(in_RSI + 0x278),
                       *(undefined8 *)(in_RSI + 0x280),*(undefined8 *)(in_RSI + 0x288),
                       *(undefined8 *)(in_RSI + 0x2b8));
    if (iVar2 < 0) {
      local_4 = -7;
    }
    else if (iVar2 < 1) {
      lVar1 = *(long *)*in_RDI;
      for (local_28 = 0; local_28 < *(int *)(in_RSI + 0xa0); local_28 = local_28 + 1) {
        iVar2 = (**(code **)(in_RSI + 0x748))
                          (in_RSI,*(undefined8 *)(lVar1 + 8 + (long)local_28 * 8),
                           *(undefined8 *)(*(long *)(in_RSI + 0x380) + (long)local_28 * 8),
                           *(undefined8 *)(in_RSI + 0x280),*(undefined8 *)(in_RSI + 0x288),
                           *(undefined8 *)(in_RSI + 0x2b8));
        if (iVar2 < 0) {
          return -7;
        }
        if (0 < iVar2) {
          return 3;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int idaNlsLSolveSensSim(N_Vector deltaSim, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval, is;
  N_Vector delta;
  N_Vector* deltaS;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* extract state update vector from the vector wrapper */
  delta = NV_VEC_SW(deltaSim, 0);

  /* solve the state linear system */
  retval = IDA_mem->ida_lsolve(IDA_mem, delta, IDA_mem->ida_ewt, IDA_mem->ida_yy,
                               IDA_mem->ida_yp, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_LSOLVE_FAIL); }
  if (retval > 0) { return (IDA_LSOLVE_RECVR); }

  /* extract sensitivity deltas from the vector wrapper */
  deltaS = NV_VECS_SW(deltaSim) + 1;

  /* solve the sensitivity linear systems */
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    retval = IDA_mem->ida_lsolve(IDA_mem, deltaS[is], IDA_mem->ida_ewtS[is],
                                 IDA_mem->ida_yy, IDA_mem->ida_yp,
                                 IDA_mem->ida_savres);

    if (retval < 0) { return (IDA_LSOLVE_FAIL); }
    if (retval > 0) { return (IDA_LSOLVE_RECVR); }
  }

  return (IDA_SUCCESS);
}